

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

index_type *
booster::locale::boundary::details::
mapping_traits<std::_List_iterator<char>,_std::bidirectional_iterator_tag>::map
          (index_type *__return_storage_ptr__,boundary_type t,_List_iterator<char> b,
          _List_iterator<char> e,locale *l)

{
  boundary_indexing<char> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<std::_List_iterator<char>>
            ((string *)&local_40,b._M_node,e._M_node);
  pbVar1 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>(l);
  (**(code **)(*(long *)pbVar1 + 0x10))
            (__return_storage_ptr__,pbVar1,t,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        std::basic_string<char_type> str(b,e);
                        return std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                    }